

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_regex.hpp
# Opt level: O2

void __thiscall iutest::detail::iuRegex::iuRegex(iuRegex *this,char *pattern)

{
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(&this->m_re);
  (this->m_pattern)._M_dataplus._M_p = (pointer)&(this->m_pattern).field_2;
  (this->m_pattern)._M_string_length = 0;
  (this->m_pattern).field_2._M_local_buf[0] = '\0';
  Init(this,pattern);
  return;
}

Assistant:

iuRegex(const ::std::string& pattern) { Init(pattern.c_str()); }